

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCreateSourceAndEventIf.cpp
# Opt level: O0

int anon_unknown.dwarf_156009::failIfCalled(void)

{
  code *pcVar1;
  byte extraout_AL;
  int iVar2;
  double __x;
  MessageBuilder _DOCTEST_MESSAGE_2;
  char (*in_stack_ffffffffffffffa8) [40];
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  Enum in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  
  doctest::detail::MessageBuilder::MessageBuilder
            ((MessageBuilder *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  doctest::detail::MessageBuilder::operator*
            ((MessageBuilder *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  doctest::detail::MessageBuilder::log((MessageBuilder *)&stack0xffffffffffffffd0,__x);
  if ((extraout_AL & 1) == 0) {
    doctest::detail::MessageBuilder::react((MessageBuilder *)0x22e658);
    doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)0x22e664);
    return 0;
  }
  pcVar1 = (code *)swi(3);
  iVar2 = (*pcVar1)();
  return iVar2;
}

Assistant:

int failIfCalled()
{
  FAIL("Argument of disabled severity evaluated");
  return 0;
}